

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuffle.cpp
# Opt level: O0

int main(void)

{
  uchar *__first;
  uchar *__last;
  ostream *poVar1;
  uint8_t C;
  uint8_t *__end1;
  uint8_t *__begin1;
  uint8_t (*__range1) [7];
  SecRandom local_18;
  uchar local_14 [4];
  SecRandom RNG;
  uint8_t S [7];
  
  RNG.fd_._0_3_ = 0x60504;
  local_14[0] = '\0';
  local_14[1] = '\x01';
  local_14[2] = '\x02';
  local_14[3] = '\x03';
  SecRandom::SecRandom(&local_18);
  __first = std::begin<unsigned_char,7ul>((uchar (*) [7])local_14);
  __last = std::end<unsigned_char,7ul>((uchar (*) [7])local_14);
  std::shuffle<unsigned_char*,SecRandom&>(__first,__last,&local_18);
  for (__end1 = local_14; __end1 != (uint8_t *)((long)&RNG.fd_ + 3); __end1 = __end1 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)*__end1);
    std::operator<<(poVar1,",");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  SecRandom::~SecRandom(&local_18);
  return 0;
}

Assistant:

int main()
{
  uint8_t S[] = {0,1,2,3,4,5,6};
  SecRandom RNG;
  std::shuffle(std::begin(S), std::end(S), RNG);
  for (uint8_t C: S) {
    std::cout << (unsigned int) C << ",";
  }
  std::cout << std::endl;
  return 0;
}